

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringBuilder.cpp
# Opt level: O0

void __thiscall
Js::JSONStringBuilder::EscapeAndAppendString(JSONStringBuilder *this,JavascriptString *str)

{
  char16 ch;
  charcount_t cVar1;
  BOOL BVar2;
  char16 *pcVar3;
  char16 *pcStack_30;
  char16 currentCharacter;
  char16 *index;
  char16 *bufferStart;
  charcount_t strLength;
  JavascriptString *str_local;
  JSONStringBuilder *this_local;
  
  cVar1 = JavascriptString::GetLength(str);
  AppendCharacter(this,L'\"');
  pcVar3 = JavascriptString::GetString(str);
  for (pcStack_30 = pcVar3; pcStack_30 < pcVar3 + cVar1; pcStack_30 = pcStack_30 + 1) {
    ch = *pcStack_30;
    if (ch == L'\b') {
      AppendCharacter(this,L'\\');
      AppendCharacter(this,L'b');
    }
    else if (ch == L'\t') {
      AppendCharacter(this,L'\\');
      AppendCharacter(this,L't');
    }
    else if (ch == L'\n') {
      AppendCharacter(this,L'\\');
      AppendCharacter(this,L'n');
    }
    else if (ch == L'\f') {
      AppendCharacter(this,L'\\');
      AppendCharacter(this,L'f');
    }
    else if (ch == L'\r') {
      AppendCharacter(this,L'\\');
      AppendCharacter(this,L'r');
    }
    else if ((ch == L'\"') || (ch == L'\\')) {
      AppendCharacter(this,L'\\');
      AppendCharacter(this,ch);
    }
    else if (((ushort)ch < 0x20) || (BVar2 = utf8::IsLowSurrogateChar(ch), BVar2 != 0)) {
      AppendEscapeSequence(this,ch);
    }
    else {
      BVar2 = utf8::IsHighSurrogateChar(ch);
      if (BVar2 == 0) {
        AppendCharacter(this,ch);
      }
      else if ((pcStack_30 + 1 < pcVar3 + cVar1) &&
              (BVar2 = utf8::IsLowSurrogateChar(pcStack_30[1]), BVar2 != 0)) {
        AppendCharacter(this,ch);
        AppendCharacter(this,pcStack_30[1]);
        pcStack_30 = pcStack_30 + 1;
      }
      else {
        AppendEscapeSequence(this,ch);
      }
    }
  }
  AppendCharacter(this,L'\"');
  return;
}

Assistant:

void
JSONStringBuilder::EscapeAndAppendString(_In_ JavascriptString* str)
{
    const charcount_t strLength = str->GetLength();

    // Strings should be surrounded by double quotes
    this->AppendCharacter(_u('"'));
    const char16* bufferStart = str->GetString();
    for (const char16* index = bufferStart; index < bufferStart + strLength; ++index)
    {
        char16 currentCharacter = *index;
        switch (currentCharacter)
        {
        case _u('"'):
        case _u('\\'):
            // Special characters are escaped with a backslash
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(currentCharacter);
            break;
        case _u('\b'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('b'));
            break;
        case _u('\f'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('f'));
            break;
        case _u('\n'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('n'));
            break;
        case _u('\r'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('r'));
            break;
        case _u('\t'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('t'));
            break;
        default:
            if (currentCharacter < _u(' ') || utf8::IsLowSurrogateChar(currentCharacter))
            {
                this->AppendEscapeSequence(currentCharacter);
            }
            else if (utf8::IsHighSurrogateChar(currentCharacter))
            {
                if (index + 1 < bufferStart + strLength && utf8::IsLowSurrogateChar(*(index + 1)))
                {
                    // Append surrogate pair normally
                    this->AppendCharacter(currentCharacter);
                    this->AppendCharacter(*(index + 1));

                    // Skip the trailing-surrogate code unit
                    index++;
                }
                else
                {
                    // High-surrogate code unit not followed by a trailing-surrogate code unit should be escaped.
                    this->AppendEscapeSequence(currentCharacter);
                }
            }
            else
            {
                this->AppendCharacter(currentCharacter);
            }
            break;
        }
    }

    this->AppendCharacter(_u('"'));
}